

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O0

void __thiscall btPoint2PointConstraint::buildJacobian(btPoint2PointConstraint *this)

{
  btScalar *pbVar1;
  btTransform *pbVar2;
  long in_RDI;
  int i;
  btVector3 normal;
  btVector3 *in_stack_fffffffffffffef8;
  btTransform *in_stack_ffffffffffffff00;
  btVector3 *in_stack_ffffffffffffff08;
  btVector3 *v1;
  btVector3 in_stack_ffffffffffffff58;
  btMatrix3x3 *this_00;
  btScalar in_stack_ffffffffffffffa0;
  btScalar in_stack_ffffffffffffffa4;
  btVector3 *in_stack_ffffffffffffffa8;
  btVector3 *in_stack_ffffffffffffffb0;
  btVector3 *in_stack_ffffffffffffffb8;
  btMatrix3x3 *in_stack_ffffffffffffffc0;
  btMatrix3x3 *in_stack_ffffffffffffffc8;
  btJacobianEntry *in_stack_ffffffffffffffd0;
  int local_28;
  btScalar local_24;
  btScalar bVar3;
  btScalar bVar4;
  btVector3 *in_stack_ffffffffffffffe8;
  
  *(undefined4 *)(in_RDI + 0x38) = 0;
  bVar4 = 0.0;
  bVar3 = 0.0;
  local_24 = 0.0;
  btVector3::btVector3
            ((btVector3 *)&stack0xffffffffffffffe8,(btScalar *)&stack0xffffffffffffffe4,
             (btScalar *)&stack0xffffffffffffffe0,&local_24);
  for (local_28 = 0; this_00 = in_stack_ffffffffffffff58.m_floats._8_8_, local_28 < 3;
      local_28 = local_28 + 1) {
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)&stack0xffffffffffffffe8);
    pbVar1[local_28] = 1.0;
    v1 = (btVector3 *)(in_RDI + 0x48 + (long)local_28 * 0x54);
    pbVar2 = btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x28));
    btTransform::getBasis(pbVar2);
    btMatrix3x3::transpose(this_00);
    pbVar2 = btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x30));
    btTransform::getBasis(pbVar2);
    btMatrix3x3::transpose(this_00);
    btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x28));
    in_stack_ffffffffffffff58 =
         btTransform::operator*(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    btRigidBody::getCenterOfMassPosition((btRigidBody *)0x211dc3);
    operator-(v1,in_stack_ffffffffffffff08);
    btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI + 0x30));
    btTransform::operator*(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    btRigidBody::getCenterOfMassPosition((btRigidBody *)0x211e18);
    operator-(v1,in_stack_ffffffffffffff08);
    in_stack_fffffffffffffef8 =
         btRigidBody::getInvInertiaDiagLocal(*(btRigidBody **)(in_RDI + 0x28));
    btRigidBody::getInvMass(*(btRigidBody **)(in_RDI + 0x28));
    in_stack_ffffffffffffff00 =
         (btTransform *)btRigidBody::getInvInertiaDiagLocal(*(btRigidBody **)(in_RDI + 0x30));
    btRigidBody::getInvMass(*(btRigidBody **)(in_RDI + 0x30));
    btJacobianEntry::btJacobianEntry
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (btVector3 *)CONCAT44(bVar4,bVar3),in_stack_ffffffffffffffa4,
               in_stack_ffffffffffffffe8,in_stack_ffffffffffffffa0);
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)&stack0xffffffffffffffe8);
    pbVar1[local_28] = 0.0;
  }
  return;
}

Assistant:

void	btPoint2PointConstraint::buildJacobian()
{

	///we need it for both methods
	{
		m_appliedImpulse = btScalar(0.);

		btVector3	normal(0,0,0);

		for (int i=0;i<3;i++)
		{
			normal[i] = 1;
			new (&m_jac[i]) btJacobianEntry(
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getCenterOfMassTransform()*m_pivotInA - m_rbA.getCenterOfMassPosition(),
			m_rbB.getCenterOfMassTransform()*m_pivotInB - m_rbB.getCenterOfMassPosition(),
			normal,
			m_rbA.getInvInertiaDiagLocal(),
			m_rbA.getInvMass(),
			m_rbB.getInvInertiaDiagLocal(),
			m_rbB.getInvMass());
		normal[i] = 0;
		}
	}


}